

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator::GenerateSerializationCode
          (ImmutableStringOneofFieldLiteGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ImmutableStringOneofFieldLiteGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_ImmutableStringFieldLiteGenerator).variables_,
                     "if ($has_oneof_case_message$) {\n  output.writeString($number$, get$capitalized_name$());\n}\n"
                    );
  return;
}

Assistant:

void ImmutableStringOneofFieldLiteGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  // Lite runtime should reduce allocations by serializing the string directly.
  // This avoids spurious intermediary ByteString allocations, cutting overall
  // allocations in half.
  printer->Print(variables_,
    "if ($has_oneof_case_message$) {\n"
    "  output.writeString($number$, get$capitalized_name$());\n"
    "}\n");
}